

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall
SubcommandProgram_Multiple_Test::~SubcommandProgram_Multiple_Test
          (SubcommandProgram_Multiple_Test *this)

{
  SubcommandProgram_Multiple_Test *this_local;
  
  SubcommandProgram::~SubcommandProgram(&this->super_SubcommandProgram);
  return;
}

Assistant:

TEST_F(SubcommandProgram, Multiple) {
    args = {"-d", "start", "-ffilename", "stop"};

    run();
    EXPECT_EQ((size_t)2, app.get_subcommands().size());
    EXPECT_EQ(1, dummy);
    EXPECT_EQ("filename", file);
}